

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * fs_get_cache_directory_abi_cxx11_(void)

{
  char *pcVar1;
  string *p;
  string *p_00;
  string *in_RDI;
  string cache_directory;
  allocator<char> local_b9;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"",(allocator<char> *)&local_98);
  pcVar1 = getenv("LLAMA_CACHE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("XDG_CACHE_HOME");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = getenv("HOME");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/.cache/",&local_b9);
      std::operator+(&local_98,pcVar1,&local_38);
      std::__cxx11::string::operator=(local_b8,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      std::__cxx11::string::assign((char *)local_b8);
    }
    std::__cxx11::string::string(local_58,local_b8);
    fs_get_cache_directory::anon_class_1_0_00000001::operator()
              (&local_98,(anon_class_1_0_00000001 *)local_58,p);
    std::__cxx11::string::operator=(local_b8,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::append((char *)local_b8);
  }
  else {
    std::__cxx11::string::assign((char *)local_b8);
  }
  std::__cxx11::string::string(local_78,local_b8);
  fs_get_cache_directory::anon_class_1_0_00000001::operator()
            (in_RDI,(anon_class_1_0_00000001 *)local_78,p_00);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_b8);
  return in_RDI;
}

Assistant:

std::string fs_get_cache_directory() {
    std::string cache_directory = "";
    auto ensure_trailing_slash = [](std::string p) {
        // Make sure to add trailing slash
        if (p.back() != DIRECTORY_SEPARATOR) {
            p += DIRECTORY_SEPARATOR;
        }
        return p;
    };
    if (getenv("LLAMA_CACHE")) {
        cache_directory = std::getenv("LLAMA_CACHE");
    } else {
#if defined(__linux__) || defined(__FreeBSD__) || defined(_AIX)
        if (std::getenv("XDG_CACHE_HOME")) {
            cache_directory = std::getenv("XDG_CACHE_HOME");
        } else {
            cache_directory = std::getenv("HOME") + std::string("/.cache/");
        }
#elif defined(__APPLE__)
        cache_directory = std::getenv("HOME") + std::string("/Library/Caches/");
#elif defined(_WIN32)
        cache_directory = std::getenv("LOCALAPPDATA");
#else
#  error Unknown architecture
#endif
        cache_directory = ensure_trailing_slash(cache_directory);
        cache_directory += "llama.cpp";
    }
    return ensure_trailing_slash(cache_directory);
}